

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

void __thiscall StatusPrinter::PrintStatus(StatusPrinter *this,Edge *edge,int64_t time_millis)

{
  Verbosity VVar1;
  int64_t in_RCX;
  string to_print;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  VVar1 = this->config_->verbosity;
  if (NO_STATUS_UPDATE < VVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"description",(allocator<char> *)&local_a0);
    Edge::GetBinding(&local_60,edge,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if ((VVar1 == VERBOSE) || (local_60._M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"command",&local_a1);
      Edge::GetBinding(&local_80,edge,&local_a0);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    FormatProgressStatus_abi_cxx11_(&local_a0,this,this->progress_status_format_,in_RCX);
    std::operator+(&local_80,&local_a0,&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_40,(string *)&local_60);
    LinePrinter::Print(&this->printer_,&local_40,(uint)(VVar1 != VERBOSE));
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void StatusPrinter::PrintStatus(const Edge* edge, int64_t time_millis) {
  if (config_.verbosity == BuildConfig::QUIET
      || config_.verbosity == BuildConfig::NO_STATUS_UPDATE)
    return;

  bool force_full_command = config_.verbosity == BuildConfig::VERBOSE;

  string to_print = edge->GetBinding("description");
  if (to_print.empty() || force_full_command)
    to_print = edge->GetBinding("command");

  to_print = FormatProgressStatus(progress_status_format_, time_millis)
      + to_print;

  printer_.Print(to_print,
                 force_full_command ? LinePrinter::FULL : LinePrinter::ELIDE);
}